

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent
          (TracingServiceImpl *this,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  RootMessage<perfetto::protos::pbzero::TracePacket> *this_00;
  TimeNanos value;
  Message *this_01;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered(&packet);
  value = base::GetBootTimeNs();
  this_00 = &packet.msg_;
  protos::pbzero::TracePacket::set_timestamp(&this_00->super_TracePacket,value.__r);
  protos::pbzero::TracePacket::set_trusted_uid(&this_00->super_TracePacket,this->uid_);
  protos::pbzero::TracePacket::set_trusted_packet_sequence_id(&this_00->super_TracePacket,1);
  this_01 = &protos::pbzero::TracePacket::
             set_service_event<perfetto::protos::pbzero::TracingServiceEvent>
                       (&this_00->super_TracePacket)->super_Message;
  protozero::Message::AppendVarInt<int>(this_01,6,1);
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0,&packet);
  anon_unknown_4::SerializeAndAppendPacket
            (packets,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f0);
  protozero::MessageArena::~MessageArena(&packet.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&packet.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&packet.shb_);
  return;
}

Assistant:

void TracingServiceImpl::EmitSeizedForBugreportLifecycleEvent(
    std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_timestamp(static_cast<uint64_t>(base::GetBootTimeNs().count()));
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  auto* service_event = packet->set_service_event();
  service_event->AppendVarInt(
      protos::pbzero::TracingServiceEvent::kSeizedForBugreportFieldNumber, 1);
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}